

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O2

float64 float64_sqrt(float64 a)

{
  int16 iVar1;
  bits32 bVar2;
  float64 fVar3;
  bits64 bVar4;
  ulong uVar5;
  ulong uVar6;
  bits64 a0;
  long lVar7;
  int iVar8;
  ulong a_00;
  bool bVar9;
  int16 aExp;
  bits64 term0;
  ulong local_40;
  bits64 term1;
  
  local_40 = a & 0xfffffffffffff;
  aExp = (ushort)(a >> 0x34) & 0x7ff;
  if (aExp == 0x7ff) {
    if (local_40 != 0) {
      fVar3 = propagateFloat64NaN(a,a);
      return fVar3;
    }
    if (-1 < (long)a) {
      return a;
    }
  }
  else {
    if (-1 < (long)a) {
      if (aExp == 0) {
        if (local_40 == 0) {
          return 0;
        }
        normalizeFloat64Subnormal(local_40,&aExp,&local_40);
      }
      iVar1 = aExp;
      iVar8 = (int)aExp;
      uVar6 = local_40 | 0x10000000000000;
      bVar2 = estimateSqrt32(aExp,(bits32)(uVar6 >> 0x15));
      a0 = uVar6 << ((byte)iVar1 & 1 ^ 9);
      uVar6 = (ulong)bVar2;
      bVar4 = estimateDiv128To64(a0,0,uVar6 << 0x20);
      a_00 = uVar6 * 0x40000000 + bVar4;
      if (((uint)bVar4 & 0x1fe) < 6) {
        mul64To128(a_00,a_00,&term0,&term1);
        uVar5 = -term1;
        uVar6 = (uVar6 * 0x80000000 + bVar4 * 2) - 1;
        for (lVar7 = (a0 - term0) - (ulong)(term1 != 0); lVar7 < 0;
            lVar7 = (lVar7 - ((long)a_00 >> 0x3f)) + (ulong)bVar9) {
          a_00 = a_00 - 1;
          bVar9 = CARRY8(uVar5,uVar6);
          uVar5 = uVar5 + uVar6;
          uVar6 = uVar6 - 2;
        }
        a_00 = a_00 | (uVar5 != 0 || lVar7 != 0);
      }
      fVar3 = roundAndPackFloat64('\0',(short)(iVar8 + 0x1fc01U >> 1) + 0x3fe,a_00);
      return fVar3;
    }
    if (((uint)(a >> 0x34) & 0x7ff) == 0 && local_40 == 0) {
      return a;
    }
  }
  float_exception_flags = float_exception_flags | 1;
  return 0xffffffffffffffff;
}

Assistant:

float64 float64_sqrt( float64 a )
{
	flag aSign;
	int16 aExp, zExp;
	bits64 aSig, zSig, doubleZSig;
	bits64 rem0, rem1, term0, term1;
//    float64 z;

	aSig = extractFloat64Frac( a );
	aExp = extractFloat64Exp( a );
	aSign = extractFloat64Sign( a );
	if ( aExp == 0x7FF ) {
		if ( aSig ) return propagateFloat64NaN( a, a );
		if ( ! aSign ) return a;
		float_raise( float_flag_invalid );
		return float64_default_nan;
	}
	if ( aSign ) {
		if ( ( aExp | aSig ) == 0 ) return a;
		float_raise( float_flag_invalid );
		return float64_default_nan;
	}
	if ( aExp == 0 ) {
		if ( aSig == 0 ) return 0;
		normalizeFloat64Subnormal( aSig, &aExp, &aSig );
	}
	zExp = ( ( aExp - 0x3FF )>>1 ) + 0x3FE;
	aSig |= LIT64( 0x0010000000000000 );
	zSig = estimateSqrt32( aExp, aSig>>21 );
	aSig <<= 9 - ( aExp & 1 );
	zSig = estimateDiv128To64( aSig, 0, zSig<<32 ) + ( zSig<<30 );
	if ( ( zSig & 0x1FF ) <= 5 ) {
		doubleZSig = zSig<<1;
		mul64To128( zSig, zSig, &term0, &term1 );
		sub128( aSig, 0, term0, term1, &rem0, &rem1 );
		while ( (sbits64) rem0 < 0 ) {
			--zSig;
			doubleZSig -= 2;
			add128( rem0, rem1, zSig>>63, doubleZSig | 1, &rem0, &rem1 );
		}
		zSig |= ( ( rem0 | rem1 ) != 0 );
	}
	return roundAndPackFloat64( 0, zExp, zSig );

}